

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall
LinearScan::FillStackLiteralBailOutRecord
          (LinearScan *this,Instr *instr,BailOutInfo *bailOutInfo,FuncBailOutData *funcBailOutData,
          uint funcCount)

{
  Allocator *this_00;
  Memory *this_01;
  StackLiteralBailOutRecord *pSVar1;
  TrackAllocData local_70;
  uint local_48;
  uint local_44;
  uint stackLiteralBailOutRecordCount;
  uint i;
  Allocator *allocator;
  uint local_2c;
  FuncBailOutData *pFStack_28;
  uint funcCount_local;
  FuncBailOutData *funcBailOutData_local;
  BailOutInfo *bailOutInfo_local;
  Instr *instr_local;
  LinearScan *this_local;
  
  if (bailOutInfo->stackLiteralBailOutInfoCount != 0) {
    allocator = (Allocator *)funcBailOutData;
    local_2c = funcCount;
    pFStack_28 = funcBailOutData;
    funcBailOutData_local = (FuncBailOutData *)bailOutInfo;
    bailOutInfo_local = (BailOutInfo *)instr;
    instr_local = (Instr *)this;
    ForEachStackLiteralBailOutInfo<LinearScan::FillStackLiteralBailOutRecord(IR::Instr*,BailOutInfo*,FuncBailOutData*,unsigned_int)::__0>
              (this,instr,bailOutInfo,funcBailOutData,funcCount,
               (anon_class_8_1_e379d892)funcBailOutData);
    _stackLiteralBailOutRecordCount = Func::GetNativeCodeDataAllocator(this->func);
    for (local_44 = 0; this_00 = _stackLiteralBailOutRecordCount, local_44 < local_2c;
        local_44 = local_44 + 1) {
      local_48 = (pFStack_28[local_44].bailOutRecord)->stackLiteralBailOutRecordCount;
      if (local_48 != 0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_70,(type_info *)&BailOutRecord::StackLiteralBailOutRecord::typeinfo,0,
                   (ulong)local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                   ,0x80e);
        this_01 = (Memory *)NativeCodeData::Allocator::TrackAllocInfo(this_00,&local_70);
        pSVar1 = Memory::
                 AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<BailOutRecord::StackLiteralBailOutRecord>>,BailOutRecord::StackLiteralBailOutRecord,false>
                           (this_01,(AllocatorNoFixup<NativeCodeData::Array<BailOutRecord::StackLiteralBailOutRecord>_>
                                     *)NativeCodeData::
                                       AllocatorNoFixup<NativeCodeData::Array<BailOutRecord::StackLiteralBailOutRecord>_>
                                       ::Alloc,0,(ulong)local_48);
        (pFStack_28[local_44].bailOutRecord)->stackLiteralBailOutRecord = pSVar1;
        (pFStack_28[local_44].bailOutRecord)->stackLiteralBailOutRecordCount = 0;
      }
    }
    ForEachStackLiteralBailOutInfo<LinearScan::FillStackLiteralBailOutRecord(IR::Instr*,BailOutInfo*,FuncBailOutData*,unsigned_int)::__1>
              (this,(Instr *)bailOutInfo_local,(BailOutInfo *)funcBailOutData_local,pFStack_28,
               local_2c,(anon_class_8_1_e379d892)pFStack_28);
  }
  return;
}

Assistant:

void
LinearScan::FillStackLiteralBailOutRecord(IR::Instr * instr, BailOutInfo * bailOutInfo, FuncBailOutData * funcBailOutData, uint funcCount)
{
    if (bailOutInfo->stackLiteralBailOutInfoCount)
    {
        // Count the data
        ForEachStackLiteralBailOutInfo(instr, bailOutInfo, funcBailOutData, funcCount,
            [=](uint funcIndex, BailOutInfo::StackLiteralBailOutInfo& stackLiteralBailOutInfo, Js::RegSlot regSlot)
        {
            funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecordCount++;
        });

        // Allocate the data
        NativeCodeData::Allocator * allocator = this->func->GetNativeCodeDataAllocator();
        for (uint i = 0; i < funcCount; i++)
        {
            uint stackLiteralBailOutRecordCount = funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecordCount;
            if (stackLiteralBailOutRecordCount)
            {
                funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecord =
                    NativeCodeDataNewArrayNoFixup(allocator, BailOutRecord::StackLiteralBailOutRecord, stackLiteralBailOutRecordCount);
                // reset the count so we can track how much we have filled below
                funcBailOutData[i].bailOutRecord->stackLiteralBailOutRecordCount = 0;
            }
        }

        // Fill out the data
        ForEachStackLiteralBailOutInfo(instr, bailOutInfo, funcBailOutData, funcCount,
            [=](uint funcIndex, BailOutInfo::StackLiteralBailOutInfo& stackLiteralBailOutInfo, Js::RegSlot regSlot)
        {
            uint& recordIndex = funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecordCount;
            BailOutRecord::StackLiteralBailOutRecord& stackLiteralBailOutRecord =
                funcBailOutData[funcIndex].bailOutRecord->stackLiteralBailOutRecord[recordIndex++];
            stackLiteralBailOutRecord.regSlot = regSlot;
            stackLiteralBailOutRecord.initFldCount = stackLiteralBailOutInfo.initFldCount;
        });
    }
}